

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerStep *
sqlite3TriggerUpdateStep
          (Parse *pParse,Token *pTableName,ExprList *pEList,Expr *pWhere,u8 orconf,char *zStart,
          char *zEnd)

{
  sqlite3 *db;
  TriggerStep *pTVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  
  db = pParse->db;
  pTVar1 = triggerStepAllocate(pParse,'v',pTableName,zStart,zEnd);
  if (pTVar1 != (TriggerStep *)0x0) {
    if (pParse->eParseMode < 2) {
      pEVar2 = sqlite3ExprListDup(db,pEList,1);
      pTVar1->pExprList = pEVar2;
      if (pWhere == (Expr *)0x0) {
        pEVar3 = (Expr *)0x0;
      }
      else {
        pEVar3 = exprDup(db,pWhere,1,(u8 **)0x0);
      }
    }
    else {
      pTVar1->pExprList = pEList;
      pEList = (ExprList *)0x0;
      pEVar3 = pWhere;
      pWhere = (Expr *)0x0;
    }
    pTVar1->pWhere = pEVar3;
    pTVar1->orconf = orconf;
  }
  if (pEList != (ExprList *)0x0) {
    exprListDeleteNN(db,pEList);
  }
  if (pWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pWhere);
  }
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerUpdateStep(
  Parse *pParse,          /* Parser */
  Token *pTableName,   /* Name of the table to be updated */
  ExprList *pEList,    /* The SET clause: list of column and new values */
  Expr *pWhere,        /* The WHERE clause */
  u8 orconf,           /* The conflict algorithm. (OE_Abort, OE_Ignore, etc) */
  const char *zStart,  /* Start of SQL text */
  const char *zEnd     /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  pTriggerStep = triggerStepAllocate(pParse, TK_UPDATE, pTableName,zStart,zEnd);
  if( pTriggerStep ){
    if( IN_RENAME_OBJECT ){
      pTriggerStep->pExprList = pEList;
      pTriggerStep->pWhere = pWhere;
      pEList = 0;
      pWhere = 0;
    }else{
      pTriggerStep->pExprList = sqlite3ExprListDup(db, pEList, EXPRDUP_REDUCE);
      pTriggerStep->pWhere = sqlite3ExprDup(db, pWhere, EXPRDUP_REDUCE);
    }
    pTriggerStep->orconf = orconf;
  }
  sqlite3ExprListDelete(db, pEList);
  sqlite3ExprDelete(db, pWhere);
  return pTriggerStep;
}